

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp_sint_t sexp_bignum_compare_abs(sexp a,sexp b)

{
  ulong uVar1;
  ulong uVar2;
  sexp_uint_t sVar3;
  sexp_uint_t sVar4;
  sexp_sint_t sVar5;
  ulong uVar6;
  
  sVar3 = sexp_bignum_hi(a);
  sVar4 = sexp_bignum_hi(b);
  if ((int)sVar3 == (int)sVar4) {
    uVar6 = sVar3 & 0xffffffff;
    while (0 < (int)uVar6) {
      uVar1 = *(ulong *)((long)&a->value + uVar6 * 8 + 8);
      uVar2 = *(ulong *)((long)&b->value + uVar6 * 8 + 8);
      if (uVar2 < uVar1) {
        return 1;
      }
      uVar6 = uVar6 - 1;
      if (uVar1 < uVar2) {
        return -1;
      }
    }
    sVar5 = 0;
  }
  else {
    sVar5 = (sexp_sint_t)((int)sVar3 - (int)sVar4);
  }
  return sVar5;
}

Assistant:

sexp_sint_t sexp_bignum_compare_abs (sexp a, sexp b) {
  int ai=sexp_bignum_hi(a), bi=sexp_bignum_hi(b);
  sexp_uint_t *adata=sexp_bignum_data(a), *bdata=sexp_bignum_data(b);
  if (ai != bi)
    return ai - bi;
  for (--ai; ai >= 0; ai--) {
    if (adata[ai] > bdata[ai])
      return 1;
    else if (adata[ai] < bdata[ai])
      return -1;
  }
  return 0;
}